

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cc
# Opt level: O1

void __thiscall flow::Value::Value(Value *this,LiteralType ty,string *name)

{
  pointer pcVar1;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  long *local_278 [2];
  long local_268 [2];
  long local_258 [2];
  undefined **local_248;
  undefined1 *local_240;
  long lStack_238;
  ulong local_230;
  undefined1 local_228 [504];
  
  this->_vptr_Value = (_func_int **)&PTR__Value_001b1720;
  this->type_ = ty;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->name_)._M_string_length == 0) {
    local_258[0] = valueCounter;
    lStack_238 = 0;
    local_248 = &PTR_grow_001aeda8;
    local_230 = 500;
    format_str.size_ = 9;
    format_str.data_ = "unnamed{}";
    args.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)local_258;
    args.types_ = 5;
    local_240 = local_228;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_248,format_str,args);
    local_278[0] = local_268;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_278,local_240,local_240 + lStack_238);
    local_248 = &PTR_grow_001aeda8;
    if (local_240 != local_228) {
      operator_delete(local_240,local_230);
    }
    std::__cxx11::string::operator=((string *)&this->name_,(string *)local_278);
    if (local_278[0] != local_268) {
      operator_delete(local_278[0],local_268[0] + 1);
    }
    valueCounter = valueCounter + 1;
  }
  return;
}

Assistant:

Value::Value(LiteralType ty, const std::string& name)
    : type_(ty), name_(name), uses_() {
  if (name_.empty()) {
    name_ = fmt::format("unnamed{}", valueCounter);
    valueCounter++;
    // printf("default-create name: %s\n", name_.c_str());
  }
}